

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O1

void __thiscall DnsStats::LoadRegisteredTLD_from_memory(DnsStats *this)

{
  uint8_t uVar1;
  char *__s;
  ulong in_RAX;
  TldAsKey *key;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  uint8_t uVar5;
  size_t i;
  long lVar6;
  bool stored;
  undefined8 uStack_38;
  
  lVar6 = 0;
  uStack_38 = in_RAX;
  do {
    uStack_38 = uStack_38 & 0xffffffffffffff;
    key = (TldAsKey *)operator_new(0x70);
    __s = RegisteredTldName[lVar6];
    sVar2 = strlen(__s);
    key->HashNext = (TldAsKey *)0x0;
    key->MoreRecentKey = (TldAsKey *)0x0;
    key->LessRecentKey = (TldAsKey *)0x0;
    key->max_name_parts = 1;
    key->count = 1;
    key->hash = 0;
    sVar4 = 0x40;
    if (sVar2 < 0x40) {
      sVar4 = sVar2;
    }
    if (sVar2 == 0) {
      sVar3 = 0;
    }
    else {
      sVar3 = 0;
      do {
        uVar1 = __s[sVar3];
        uVar5 = uVar1 + 0xe0;
        if (0x19 < (byte)(uVar1 + 0x9f)) {
          uVar5 = uVar1;
        }
        key->tld[sVar3] = uVar5;
        sVar3 = sVar3 + 1;
      } while (sVar4 != sVar3);
    }
    key->tld_len = sVar3;
    key->tld[sVar3] = '\0';
    BinHash<TldAsKey>::InsertOrAdd(&this->registeredTld,key,false,(bool *)((long)&uStack_38 + 7));
    if (uStack_38._7_1_ == '\0') {
      operator_delete(key);
    }
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x5a3);
  return;
}

Assistant:

void DnsStats::LoadRegisteredTLD_from_memory()
{
    for (size_t i = 0; i < RegisteredTldNameNb; i++)
    {
        bool stored = false;
        TldAsKey * tak = new
            TldAsKey((uint8_t *) RegisteredTldName[i], strlen(RegisteredTldName[i]));

        registeredTld.InsertOrAdd(tak, false, &stored);

        if (!stored)
        {
            delete tak;
        }
    }
}